

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O2

void __thiscall
MCTS::Node<GoState<3U,_3U>_>::Node
          (Node<GoState<3U,_3U>_> *this,GoState<3U,_3U> *state,Move *move_,
          Node<GoState<3U,_3U>_> *parent_)

{
  this->move = *move_;
  this->parent = parent_;
  this->player_to_move = state->player_to_move;
  this->wins = 0.0;
  this->visits = 0;
  (*state->_vptr_GoState[0xc])(&this->moves);
  (this->children).
  super__Vector_base<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->UCT_score = 0.0;
  (this->children).
  super__Vector_base<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).
  super__Vector_base<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

Node<State>::Node(const State& state, const Move& move_, Node* parent_) :
	move(move_),
	parent(parent_),
	player_to_move(state.player_to_move),
	wins(0),
	visits(0),
	moves(state.get_moves()),
	UCT_score(0)
{ }